

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QWidget * containerWidget(QWidget *w)

{
  QLineEdit *pQVar1;
  QComboBox *pQVar2;
  QWidget *pQVar3;
  QAbstractSpinBox *pQVar4;
  QAbstractScrollArea *pQVar5;
  QWidget *in_RDI;
  QAbstractScrollArea *sa;
  QWidget *local_8;
  
  pQVar1 = qobject_cast<QLineEdit_const*>((QObject *)0x439e03);
  if (pQVar1 != (QLineEdit *)0x0) {
    QWidget::parentWidget((QWidget *)0x439e13);
    pQVar2 = qobject_cast<QComboBox_const*>((QObject *)0x439e1b);
    if (pQVar2 != (QComboBox *)0x0) {
      pQVar3 = QWidget::parentWidget((QWidget *)0x439e2b);
      return pQVar3;
    }
    QWidget::parentWidget((QWidget *)0x439e3c);
    pQVar4 = qobject_cast<QAbstractSpinBox_const*>((QObject *)0x439e44);
    if (pQVar4 != (QAbstractSpinBox *)0x0) {
      pQVar3 = QWidget::parentWidget((QWidget *)0x439e54);
      return pQVar3;
    }
  }
  QWidget::parentWidget((QWidget *)0x439e67);
  pQVar5 = qobject_cast<QAbstractScrollArea_const*>((QObject *)0x439e6f);
  local_8 = in_RDI;
  if ((pQVar5 != (QAbstractScrollArea *)0x0) &&
     (pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI), local_8 = in_RDI,
     pQVar3 == in_RDI)) {
    local_8 = QWidget::parentWidget((QWidget *)0x439e94);
  }
  return local_8;
}

Assistant:

static QWidget *containerWidget(const QWidget *w)
{
#if QT_CONFIG(lineedit)
    if (qobject_cast<const QLineEdit *>(w)) {
        //if the QLineEdit is an embeddedWidget, we need the rule of the real widget
#if QT_CONFIG(combobox)
        if (qobject_cast<const QComboBox *>(w->parentWidget()))
            return w->parentWidget();
#endif
#if QT_CONFIG(spinbox)
        if (qobject_cast<const QAbstractSpinBox *>(w->parentWidget()))
            return w->parentWidget();
#endif
    }
#endif // QT_CONFIG(lineedit)

#if QT_CONFIG(scrollarea)
    if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w->parentWidget())) {
        if (sa->viewport() == w)
            return w->parentWidget();
    }
#endif

    return const_cast<QWidget *>(w);
}